

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImRect IVar5;
  
  IVar5 = ImGuiWindow::Rect(window);
  fVar2 = IVar5.Max.x;
  fVar3 = IVar5.Max.y;
  fVar1 = IVar5.Min.x;
  fVar4 = IVar5.Min.y;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar2 = fVar2 + -1.0;
    fVar3 = fVar3 + -1.0;
  }
  switch(border_n) {
  case 0:
    fVar2 = fVar2 - perp_padding;
    fVar3 = fVar4 + thickness;
    fVar1 = fVar1 + perp_padding;
    break;
  case 1:
    fVar3 = fVar3 - perp_padding;
    fVar1 = fVar2 - thickness;
    fVar4 = fVar4 + perp_padding;
    break;
  case 2:
    fVar1 = fVar1 + perp_padding;
    fVar4 = fVar3 - thickness;
    fVar2 = fVar2 - perp_padding;
    break;
  case 3:
    fVar4 = fVar4 + perp_padding;
    fVar2 = thickness + fVar1;
    fVar3 = fVar3 - perp_padding;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1625,"ImRect GetBorderRect(ImGuiWindow *, int, float, float)");
  }
  IVar5.Min.y = fVar4;
  IVar5.Min.x = fVar1;
  IVar5.Max.y = fVar3;
  IVar5.Max.x = fVar2;
  return IVar5;
}

Assistant:

static ImRect GetBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y,                rect.Max.x - perp_padding, rect.Min.y + thickness);
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x,                rect.Max.y - perp_padding);
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y);
    if (border_n == 3) return ImRect(rect.Min.x,                rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);
    IM_ASSERT(0);
    return ImRect();
}